

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall
jpgd::jpeg_decoder::decode_scan(jpeg_decoder *this,pDecode_block_func decode_block_func)

{
  int iVar1;
  int local_58;
  int local_54;
  int block_y_mcu_ofs;
  int block_x_mcu_ofs;
  int component_id;
  int component_num;
  int m_block_y_mcu [4];
  int block_x_mcu [4];
  int local_20;
  int mcu_block;
  int mcu_col;
  int mcu_row;
  pDecode_block_func decode_block_func_local;
  jpeg_decoder *this_local;
  
  memset(&component_id,0,0x10);
  for (local_20 = 0; local_20 < this->m_mcus_per_col; local_20 = local_20 + 1) {
    memset(m_block_y_mcu + 2,0,0x10);
    for (mcu_block = 0; mcu_block < this->m_mcus_per_row; mcu_block = mcu_block + 1) {
      local_54 = 0;
      local_58 = 0;
      if ((this->m_restart_interval != 0) && (this->m_restarts_left == 0)) {
        process_restart(this);
      }
      for (block_x_mcu[3] = 0; block_x_mcu[3] < this->m_blocks_per_mcu;
          block_x_mcu[3] = block_x_mcu[3] + 1) {
        iVar1 = this->m_mcu_org[block_x_mcu[3]];
        (*decode_block_func)
                  (this,iVar1,m_block_y_mcu[(long)iVar1 + 2] + local_54,
                   (&component_id)[iVar1] + local_58);
        if (this->m_comps_in_scan == 1) {
          m_block_y_mcu[(long)iVar1 + 2] = m_block_y_mcu[(long)iVar1 + 2] + 1;
        }
        else {
          local_54 = local_54 + 1;
          if (local_54 == this->m_comp_h_samp[iVar1]) {
            local_54 = 0;
            local_58 = local_58 + 1;
            if (local_58 == this->m_comp_v_samp[iVar1]) {
              local_58 = 0;
              m_block_y_mcu[(long)iVar1 + 2] =
                   this->m_comp_h_samp[iVar1] + m_block_y_mcu[(long)iVar1 + 2];
            }
          }
        }
      }
      this->m_restarts_left = this->m_restarts_left + -1;
    }
    if (this->m_comps_in_scan == 1) {
      (&component_id)[this->m_comp_list[0]] = (&component_id)[this->m_comp_list[0]] + 1;
    }
    else {
      for (block_x_mcu_ofs = 0; block_x_mcu_ofs < this->m_comps_in_scan;
          block_x_mcu_ofs = block_x_mcu_ofs + 1) {
        iVar1 = this->m_comp_list[block_x_mcu_ofs];
        (&component_id)[iVar1] = this->m_comp_v_samp[iVar1] + (&component_id)[iVar1];
      }
    }
  }
  return;
}

Assistant:

void jpeg_decoder::decode_scan(pDecode_block_func decode_block_func)
{
  int mcu_row, mcu_col, mcu_block;
  int block_x_mcu[JPGD_MAX_COMPONENTS], m_block_y_mcu[JPGD_MAX_COMPONENTS];

  memset(m_block_y_mcu, 0, sizeof(m_block_y_mcu));

  for (mcu_col = 0; mcu_col < m_mcus_per_col; mcu_col++)
  {
    int component_num, component_id;

    memset(block_x_mcu, 0, sizeof(block_x_mcu));

    for (mcu_row = 0; mcu_row < m_mcus_per_row; mcu_row++)
    {
      int block_x_mcu_ofs = 0, block_y_mcu_ofs = 0;

      if ((m_restart_interval) && (m_restarts_left == 0))
        process_restart();

      for (mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++)
      {
        component_id = m_mcu_org[mcu_block];

        decode_block_func(this, component_id, block_x_mcu[component_id] + block_x_mcu_ofs, m_block_y_mcu[component_id] + block_y_mcu_ofs);

        if (m_comps_in_scan == 1)
          block_x_mcu[component_id]++;
        else
        {
          if (++block_x_mcu_ofs == m_comp_h_samp[component_id])
          {
            block_x_mcu_ofs = 0;

            if (++block_y_mcu_ofs == m_comp_v_samp[component_id])
            {
              block_y_mcu_ofs = 0;
              block_x_mcu[component_id] += m_comp_h_samp[component_id];
            }
          }
        }
      }

      m_restarts_left--;
    }

    if (m_comps_in_scan == 1)
      m_block_y_mcu[m_comp_list[0]]++;
    else
    {
      for (component_num = 0; component_num < m_comps_in_scan; component_num++)
      {
        component_id = m_comp_list[component_num];
        m_block_y_mcu[component_id] += m_comp_v_samp[component_id];
      }
    }
  }
}